

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O2

void jsons_print_uniques(lyout *out,lys_unique *unique,uint8_t unique_size,int *first)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((int)CONCAT71(in_register_00000011,unique_size) != 0) {
    pcVar1 = ",";
    if ((first != (int *)0x0) && (pcVar1 = "", *first == 0)) {
      pcVar1 = ",";
    }
    ly_print(out,"%s\"uniques\":[",pcVar1);
    for (uVar2 = 0; uVar2 != unique_size; uVar2 = uVar2 + 1) {
      pcVar1 = ",";
      if (uVar2 == 0) {
        pcVar1 = "";
      }
      ly_print(out,"%s[",pcVar1);
      for (uVar3 = 0; uVar3 < unique[uVar2].expr_size; uVar3 = uVar3 + 1) {
        pcVar1 = ",";
        if (uVar3 == 0) {
          pcVar1 = "";
        }
        ly_print(out,"%s\"%s\"",pcVar1,unique[uVar2].expr[uVar3]);
      }
      ly_print(out,"]");
    }
    ly_print(out,"]");
    if (first != (int *)0x0) {
      *first = 0;
    }
  }
  return;
}

Assistant:

static void
jsons_print_uniques(struct lyout *out, const struct lys_unique *unique, uint8_t unique_size, int *first)
{
    int i, j;

    if (!unique_size) {
        return;
    }

    ly_print(out, "%s\"uniques\":[", (first && (*first)) ? "" : ",");
    for (i = 0; i < unique_size; ++i) {
        ly_print(out, "%s[", i ? "," : "");
        for (j = 0; j < unique[i].expr_size; ++j) {
            ly_print(out, "%s\"%s\"", j ? "," : "", unique[i].expr[j]);
        }
        ly_print(out, "]");
    }
    ly_print(out, "]");
    if (first) {
        (*first) = 0;
    }
}